

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Packing_x86_fma::forward_int8
          (Packing_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint _elempack;
  uint _w;
  uint _h;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int i;
  long lVar19;
  ulong uVar20;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  
  if ((this->super_Packing).use_padding == 0) {
    uVar1 = bottom_blob->elempack;
    uVar20 = (ulong)uVar1;
    _elempack = (this->super_Packing).out_elempack;
    if (uVar1 != _elempack) {
      uVar5 = bottom_blob->elemsize;
      bVar9 = _elempack == 1;
      bVar10 = uVar1 == 8;
      bVar11 = _elempack == 8;
      bVar12 = uVar1 == 1;
      if ((!bVar11 || !bVar12) && (!bVar9 || !bVar10)) goto LAB_00497f5a;
      iVar13 = bottom_blob->dims;
      _w = bottom_blob->w;
      _h = bottom_blob->h;
      iVar14 = bottom_blob->d;
      uVar2 = bottom_blob->c;
      uVar3 = _h;
      if ((((iVar13 != 2) && (uVar3 = _w, iVar13 != 1)) ||
          ((int)(uVar3 * uVar1) % (int)_elempack == 0)) &&
         ((1 < iVar13 - 3U || ((int)(uVar2 * uVar1) % (int)_elempack == 0)))) {
        if (iVar13 == 2) {
          uVar8 = (long)(int)(uVar1 * _h) / (long)(int)_elempack;
          iVar13 = (int)uVar8;
          Mat::create(top_blob,_w,iVar13,(ulong)_elempack * (uVar5 / uVar20),_elempack,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          if ((bVar11 && bVar12) && 0 < iVar13) {
            local_88 = 7;
            local_80 = 6;
            local_50 = 5;
            local_58 = 4;
            local_60 = 3;
            local_68 = 2;
            local_70 = 1;
            local_78 = 0;
            uVar20 = 0;
            do {
              if (0 < (int)_w) {
                sVar15 = bottom_blob->elemsize;
                lVar18 = (long)bottom_blob->w;
                lVar16 = top_blob->elemsize * uVar20 * (long)top_blob->w;
                pvVar6 = bottom_blob->data;
                pvVar7 = top_blob->data;
                lVar19 = 0;
                do {
                  *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16) =
                       *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_78 * lVar18);
                  *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 1) =
                       *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_70 * lVar18);
                  *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 2) =
                       *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_68 * lVar18);
                  *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 3) =
                       *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_60 * lVar18);
                  *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 4) =
                       *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_58 * lVar18);
                  *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 5) =
                       *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_50 * lVar18);
                  *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 6) =
                       *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_80 * lVar18);
                  *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 7) =
                       *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_88 * lVar18);
                  lVar19 = lVar19 + 1;
                } while (_w != (uint)lVar19);
              }
              uVar20 = uVar20 + 1;
              local_88 = local_88 + 8;
              local_80 = local_80 + 8;
              local_50 = local_50 + 8;
              local_58 = local_58 + 8;
              local_60 = local_60 + 8;
              local_68 = local_68 + 8;
              local_70 = local_70 + 8;
              local_78 = local_78 + 8;
            } while (uVar20 != (uVar8 & 0xffffffff));
          }
          if ((bVar9 && bVar10) && 0 < (int)_h) {
            local_88 = 7;
            local_80 = 6;
            local_50 = 5;
            local_58 = 4;
            local_60 = 3;
            local_68 = 2;
            local_70 = 1;
            local_78 = 0;
            uVar20 = 0;
            do {
              if (0 < (int)_w) {
                pvVar6 = top_blob->data;
                sVar15 = top_blob->elemsize;
                lVar18 = (long)top_blob->w;
                lVar16 = bottom_blob->elemsize * uVar20 * (long)bottom_blob->w;
                pvVar7 = bottom_blob->data;
                lVar19 = 0;
                do {
                  *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_78 * lVar18) =
                       *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16);
                  *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_70 * lVar18) =
                       *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 1);
                  *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_68 * lVar18) =
                       *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 2);
                  *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_60 * lVar18) =
                       *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 3);
                  *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_58 * lVar18) =
                       *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 4);
                  *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_50 * lVar18) =
                       *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 5);
                  *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_80 * lVar18) =
                       *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 6);
                  *(undefined1 *)((long)pvVar6 + lVar19 + sVar15 * local_88 * lVar18) =
                       *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 7);
                  lVar19 = lVar19 + 1;
                } while (_w != (uint)lVar19);
              }
              uVar20 = uVar20 + 1;
              local_88 = local_88 + 8;
              local_80 = local_80 + 8;
              local_50 = local_50 + 8;
              local_58 = local_58 + 8;
              local_60 = local_60 + 8;
              local_68 = local_68 + 8;
              local_70 = local_70 + 8;
              local_78 = local_78 + 8;
            } while (uVar20 != _h);
            return 0;
          }
        }
        else {
          if (iVar13 == 1) {
            if (top_blob != bottom_blob) {
              piVar4 = bottom_blob->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = top_blob->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              piVar4 = bottom_blob->refcount;
              top_blob->data = bottom_blob->data;
              top_blob->refcount = piVar4;
              top_blob->elemsize = bottom_blob->elemsize;
              top_blob->elempack = bottom_blob->elempack;
              top_blob->allocator = bottom_blob->allocator;
              iVar13 = bottom_blob->w;
              iVar14 = bottom_blob->h;
              iVar17 = bottom_blob->d;
              top_blob->dims = bottom_blob->dims;
              top_blob->w = iVar13;
              top_blob->h = iVar14;
              top_blob->d = iVar17;
              top_blob->c = bottom_blob->c;
              top_blob->cstep = bottom_blob->cstep;
            }
            iVar13 = (this->super_Packing).out_elempack;
            iVar14 = (int)(uVar1 * _w) / iVar13;
            top_blob->w = iVar14;
            top_blob->cstep = (long)iVar14;
            top_blob->elemsize = (uVar5 / uVar20) * (long)iVar13;
            top_blob->elempack = iVar13;
            return 0;
          }
          if (iVar13 - 3U < 2) {
            uVar8 = (long)(int)(uVar1 * uVar2) / (long)(int)_elempack;
            sVar15 = (uVar5 / uVar20) * (ulong)_elempack;
            iVar17 = (int)uVar8;
            if (iVar13 == 3) {
              Mat::create(top_blob,_w,_h,iVar17,sVar15,_elempack,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,_w,_h,iVar14,iVar17,sVar15,_elempack,opt->blob_allocator);
            }
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep == 0) {
              return -100;
            }
            iVar14 = _w * _h * iVar14;
            if ((bVar11 && bVar12) && 0 < iVar17) {
              local_80 = 7;
              local_50 = 6;
              local_58 = 5;
              local_60 = 4;
              local_68 = 3;
              local_70 = 2;
              local_78 = 1;
              local_48 = 0;
              local_88 = 0;
              do {
                if (0 < iVar14) {
                  pvVar6 = bottom_blob->data;
                  lVar16 = top_blob->cstep * top_blob->elemsize * local_88;
                  pvVar7 = top_blob->data;
                  lVar19 = bottom_blob->cstep * bottom_blob->elemsize;
                  lVar18 = 0;
                  do {
                    *(undefined1 *)((long)pvVar7 + lVar18 * 8 + lVar16) =
                         *(undefined1 *)((long)pvVar6 + lVar18 + lVar19 * local_48);
                    *(undefined1 *)((long)pvVar7 + lVar18 * 8 + lVar16 + 1) =
                         *(undefined1 *)((long)pvVar6 + lVar18 + lVar19 * local_78);
                    *(undefined1 *)((long)pvVar7 + lVar18 * 8 + lVar16 + 2) =
                         *(undefined1 *)((long)pvVar6 + lVar18 + lVar19 * local_70);
                    *(undefined1 *)((long)pvVar7 + lVar18 * 8 + lVar16 + 3) =
                         *(undefined1 *)((long)pvVar6 + lVar18 + lVar19 * local_68);
                    *(undefined1 *)((long)pvVar7 + lVar18 * 8 + lVar16 + 4) =
                         *(undefined1 *)((long)pvVar6 + lVar18 + lVar19 * local_60);
                    *(undefined1 *)((long)pvVar7 + lVar18 * 8 + lVar16 + 5) =
                         *(undefined1 *)((long)pvVar6 + lVar18 + lVar19 * local_58);
                    *(undefined1 *)((long)pvVar7 + lVar18 * 8 + lVar16 + 6) =
                         *(undefined1 *)((long)pvVar6 + lVar18 + lVar19 * local_50);
                    *(undefined1 *)((long)pvVar7 + lVar18 * 8 + lVar16 + 7) =
                         *(undefined1 *)((long)pvVar6 + lVar18 + lVar19 * local_80);
                    lVar18 = lVar18 + 1;
                  } while (iVar14 != (int)lVar18);
                }
                local_88 = local_88 + 1;
                local_80 = local_80 + 8;
                local_50 = local_50 + 8;
                local_58 = local_58 + 8;
                local_60 = local_60 + 8;
                local_68 = local_68 + 8;
                local_70 = local_70 + 8;
                local_78 = local_78 + 8;
                local_48 = local_48 + 8;
              } while (local_88 != (uVar8 & 0xffffffff));
            }
            if ((bVar9 && bVar10) && 0 < (int)uVar2) {
              local_80 = 7;
              local_50 = 6;
              local_58 = 5;
              local_60 = 4;
              local_68 = 3;
              local_70 = 2;
              local_78 = 1;
              local_48 = 0;
              local_88 = 0;
              do {
                if (0 < iVar14) {
                  pvVar6 = top_blob->data;
                  lVar18 = top_blob->cstep * top_blob->elemsize;
                  lVar16 = bottom_blob->cstep * bottom_blob->elemsize * local_88;
                  pvVar7 = bottom_blob->data;
                  lVar19 = 0;
                  do {
                    *(undefined1 *)((long)pvVar6 + lVar19 + lVar18 * local_48) =
                         *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16);
                    *(undefined1 *)((long)pvVar6 + lVar19 + lVar18 * local_78) =
                         *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 1);
                    *(undefined1 *)((long)pvVar6 + lVar19 + lVar18 * local_70) =
                         *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 2);
                    *(undefined1 *)((long)pvVar6 + lVar19 + lVar18 * local_68) =
                         *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 3);
                    *(undefined1 *)((long)pvVar6 + lVar19 + lVar18 * local_60) =
                         *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 4);
                    *(undefined1 *)((long)pvVar6 + lVar19 + lVar18 * local_58) =
                         *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 5);
                    *(undefined1 *)((long)pvVar6 + lVar19 + lVar18 * local_50) =
                         *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 6);
                    *(undefined1 *)((long)pvVar6 + lVar19 + lVar18 * local_80) =
                         *(undefined1 *)((long)pvVar7 + lVar19 * 8 + lVar16 + 7);
                    lVar19 = lVar19 + 1;
                  } while (iVar14 != (int)lVar19);
                }
                local_88 = local_88 + 1;
                local_80 = local_80 + 8;
                local_50 = local_50 + 8;
                local_58 = local_58 + 8;
                local_60 = local_60 + 8;
                local_68 = local_68 + 8;
                local_70 = local_70 + 8;
                local_78 = local_78 + 8;
                local_48 = local_48 + 8;
              } while (local_88 != uVar2);
              return 0;
            }
          }
        }
        return 0;
      }
    }
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar13 = bottom_blob->w;
      iVar14 = bottom_blob->h;
      iVar17 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar13;
      top_blob->h = iVar14;
      top_blob->d = iVar17;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
    return 0;
  }
LAB_00497f5a:
  iVar13 = Packing::forward(&this->super_Packing,bottom_blob,top_blob,opt);
  return iVar13;
}

Assistant:

int Packing_x86_fma::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (use_padding)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    bool pack1to8 = elempack == 1 && out_elempack == 8;
    bool pack8to1 = elempack == 8 && out_elempack == 1;

    if (!pack1to8 && !pack8to1)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        top_blob = bottom_blob;
        top_blob.w = w * elempack / out_elempack;
        top_blob.cstep = w * elempack / out_elempack;
        top_blob.elemsize = elemsize / elempack * out_elempack;
        top_blob.elempack = out_elempack;
        return 0;
    }

    if (dims == 2)
    {
        int outh = h * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i * 8);
                const signed char* r1 = bottom_blob.row<const signed char>(i * 8 + 1);
                const signed char* r2 = bottom_blob.row<const signed char>(i * 8 + 2);
                const signed char* r3 = bottom_blob.row<const signed char>(i * 8 + 3);
                const signed char* r4 = bottom_blob.row<const signed char>(i * 8 + 4);
                const signed char* r5 = bottom_blob.row<const signed char>(i * 8 + 5);
                const signed char* r6 = bottom_blob.row<const signed char>(i * 8 + 6);
                const signed char* r7 = bottom_blob.row<const signed char>(i * 8 + 7);

                signed char* outptr = top_blob.row<signed char>(i);

                int j = 0;
                for (; j < w; j++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i);

                signed char* outptr0 = top_blob.row<signed char>(i * 8);
                signed char* outptr1 = top_blob.row<signed char>(i * 8 + 1);
                signed char* outptr2 = top_blob.row<signed char>(i * 8 + 2);
                signed char* outptr3 = top_blob.row<signed char>(i * 8 + 3);
                signed char* outptr4 = top_blob.row<signed char>(i * 8 + 4);
                signed char* outptr5 = top_blob.row<signed char>(i * 8 + 5);
                signed char* outptr6 = top_blob.row<signed char>(i * 8 + 6);
                signed char* outptr7 = top_blob.row<signed char>(i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int size = w * h * d;
        int outc = channels * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3)
            top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        else // if (dims == 4)
            top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const signed char* r0 = bottom_blob.channel(q * 8);
                const signed char* r1 = bottom_blob.channel(q * 8 + 1);
                const signed char* r2 = bottom_blob.channel(q * 8 + 2);
                const signed char* r3 = bottom_blob.channel(q * 8 + 3);
                const signed char* r4 = bottom_blob.channel(q * 8 + 4);
                const signed char* r5 = bottom_blob.channel(q * 8 + 5);
                const signed char* r6 = bottom_blob.channel(q * 8 + 6);
                const signed char* r7 = bottom_blob.channel(q * 8 + 7);

                signed char* outptr = top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* r0 = bottom_blob.channel(q);

                signed char* outptr0 = top_blob.channel(q * 8);
                signed char* outptr1 = top_blob.channel(q * 8 + 1);
                signed char* outptr2 = top_blob.channel(q * 8 + 2);
                signed char* outptr3 = top_blob.channel(q * 8 + 3);
                signed char* outptr4 = top_blob.channel(q * 8 + 4);
                signed char* outptr5 = top_blob.channel(q * 8 + 5);
                signed char* outptr6 = top_blob.channel(q * 8 + 6);
                signed char* outptr7 = top_blob.channel(q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    return 0;
}